

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChDampingCosserat::ComputeDampingMatrix
          (ChDampingCosserat *this,ChMatrixNM<double,_6,_6> *R,ChVector<double> *dstrain_e,
          ChVector<double> *dstrain_k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  ulong uVar10;
  double *pdVar11;
  int i;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ChVector<double> v;
  ChVector<double> bstress_m;
  ChVector<double> bstress_n;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  double local_108;
  long lStack_100;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_a8 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  double local_48 [3];
  
  lVar12 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0.0;
  local_78 = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8 = 0.0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0.0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_48[0] = dstrain_e->m_data[0];
  local_48[1] = dstrain_e->m_data[1];
  local_48[2] = dstrain_e->m_data[2];
  local_a8[0] = dstrain_k->m_data[0];
  local_a8[1] = dstrain_k->m_data[1];
  local_a8[2] = dstrain_k->m_data[2];
  iVar9 = (*this->_vptr_ChDampingCosserat[2])();
  uVar10 = CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),7);
  uVar13 = (ushort)uVar10;
  pdVar11 = (double *)R;
  do {
    local_48[lVar12] = local_48[lVar12] + 1e-06;
    iVar9 = (*this->_vptr_ChDampingCosserat[2])(this,&local_c8,&local_e8,local_48,local_a8);
    auVar3._8_8_ = uStack_c0;
    auVar3._0_8_ = local_c8;
    uVar14 = uVar10 & 0xffff;
    lVar12 = lVar12 + 1;
    auVar7._8_8_ = uStack_60;
    auVar7._0_8_ = local_68;
    auVar1 = vsubpd_avx(auVar3,auVar7);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar15._0_8_ = local_108 * 1000000.0;
    auVar15._8_8_ = (double)((ulong)((byte)(uVar13 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar15._16_8_ =
         (double)((ulong)((byte)(uVar13 >> 2) & 1) * (long)(local_b8 - local_58)) * 1000000.0;
    auVar15._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(pdVar11) + _DAT_0096bbc0,uVar14,auVar15);
    auVar1._8_8_ = uStack_e0;
    auVar1._0_8_ = local_e8;
    auVar5._8_8_ = uStack_80;
    auVar5._0_8_ = local_88;
    auVar1 = vsubpd_avx(auVar1,auVar5);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar16._0_8_ = local_108 * 1000000.0;
    auVar16._8_8_ = (double)((ulong)((byte)(uVar13 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar16._16_8_ =
         (double)((ulong)((byte)(uVar13 >> 2) & 1) * (long)(local_d8 - local_78)) * 1000000.0;
    auVar16._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(pdVar11) + ZEXT832(0x90) + _DAT_0096bbc0,uVar14,auVar16);
    pdVar11 = pdVar11 + 1;
  } while (lVar12 != 3);
  uVar10 = CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),7);
  pdVar11 = (R->super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>).m_storage.m_data.array
            + 0x15;
  lVar12 = 0;
  uVar13 = (ushort)uVar10;
  do {
    local_a8[lVar12] = local_a8[lVar12] + 1e-06;
    (*this->_vptr_ChDampingCosserat[2])(this,&local_c8,&local_e8,local_48,local_a8);
    auVar4._8_8_ = uStack_c0;
    auVar4._0_8_ = local_c8;
    uVar14 = uVar10 & 0xffff;
    auVar8._8_8_ = uStack_60;
    auVar8._0_8_ = local_68;
    auVar1 = vsubpd_avx(auVar4,auVar8);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar17._0_8_ = local_108 * 1000000.0;
    auVar17._8_8_ = (double)((ulong)((byte)(uVar13 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar17._16_8_ =
         (double)((ulong)((byte)(uVar13 >> 2) & 1) * (long)(local_b8 - local_58)) * 1000000.0;
    auVar17._24_8_ = 0;
    vscatterqpd_avx512vl
              (ZEXT832(pdVar11) + ZEXT832(0xffffffffffffff70) + _DAT_0096bbc0,uVar14,auVar17);
    auVar2._8_8_ = uStack_e0;
    auVar2._0_8_ = local_e8;
    auVar6._8_8_ = uStack_80;
    auVar6._0_8_ = local_88;
    auVar1 = vsubpd_avx(auVar2,auVar6);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar18._0_8_ = local_108 * 1000000.0;
    auVar18._8_8_ = (double)((ulong)((byte)(uVar13 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar18._16_8_ =
         (double)((ulong)((byte)(uVar13 >> 2) & 1) * (long)(local_d8 - local_78)) * 1000000.0;
    auVar18._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(pdVar11) + _DAT_0096bbc0,uVar14,auVar18);
    pdVar11 = pdVar11 + 1;
    local_a8[lVar12] = local_a8[lVar12] + -1e-06;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  return;
}

Assistant:

void ChDampingCosserat::ComputeDampingMatrix(ChMatrixNM<double, 6, 6>& R,
                                             const ChVector<>& dstrain_e,
                                             const ChVector<>& dstrain_k) {
    double epsi = 1e-6;
    double invepsi = 1.0 / epsi;
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> bstress_n;
    ChVector<> bstress_m;
    ChVector<> strain_e_inc = dstrain_e;
    ChVector<> strain_k_inc = dstrain_k;
    this->ComputeStress(astress_n, astress_m, dstrain_e, dstrain_k);
    for (int i = 0; i < 3; ++i) {
        strain_e_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        R.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        R.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
    }
    for (int i = 0; i < 3; ++i) {
        strain_k_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        R.block(0, i + 3, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        R.block(3, i + 3, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
        strain_k_inc[i] -= epsi;
    }
}